

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pr.cpp
# Opt level: O3

string * tid_to_string_abi_cxx11_(string *__return_storage_ptr__,id *tid)

{
  ostringstream *this;
  ostringstream oss;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  this = local_190;
  std::__cxx11::ostringstream::ostringstream(this);
  if (tid->_M_thread == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"thread::id of a non-executing thread",0x24);
  }
  else {
    this = (ostringstream *)std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + (char)this);
  std::ostream::put((char)this);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string tid_to_string(const thread::id& tid)
{
    ostringstream oss;
    oss << tid << endl;
    return oss.str();
}